

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

void __thiscall Imf_2_5::DwaCompressor::initializeLegacyChannelRules(DwaCompressor *this)

{
  string *suffix;
  char *__s;
  value_type *__x;
  long in_RDI;
  value_type *in_stack_fffffffffffff5b8;
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
  *in_stack_fffffffffffff5c0;
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
  *this_00;
  allocator<char> *in_stack_fffffffffffff5f0;
  allocator<char> *__a;
  char *in_stack_fffffffffffff5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string *in_stack_fffffffffffff608;
  Classifier *in_stack_fffffffffffff610;
  Classifier *this_02;
  undefined1 local_8a9 [88];
  allocator<char> local_851;
  string local_850 [87];
  allocator<char> local_7f9;
  string local_7f8 [87];
  allocator<char> local_7a1;
  string local_7a0 [87];
  undefined1 local_749 [88];
  undefined1 local_6f1 [88];
  allocator<char> local_699;
  string local_698 [87];
  allocator<char> local_641;
  string local_640 [87];
  allocator<char> local_5e9;
  string local_5e8 [87];
  allocator<char> local_591;
  string local_590 [87];
  allocator<char> local_539;
  string local_538 [87];
  allocator<char> local_4e1;
  string local_4e0 [87];
  allocator<char> local_489;
  string local_488 [87];
  allocator<char> local_431;
  string local_430 [87];
  allocator<char> local_3d9;
  string local_3d8 [87];
  allocator<char> local_381;
  string local_380 [87];
  allocator<char> local_329;
  string local_328 [87];
  allocator<char> local_2d1;
  string local_2d0 [87];
  allocator<char> local_279;
  string local_278 [87];
  allocator<char> local_221;
  string local_220 [87];
  allocator<char> local_1c9;
  string local_1c8 [87];
  allocator<char> local_171;
  string local_170 [87];
  allocator<char> local_119;
  string local_118 [87];
  allocator<char> local_c1;
  string local_c0 [103];
  allocator<char> local_59;
  string local_58 [88];
  
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  clear((vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
         *)0xa64633);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  Classifier::Classifier
            (in_stack_fffffffffffff610,in_stack_fffffffffffff608,
             (CompressorScheme)((ulong)in_stack_fffffffffffff600 >> 0x20),
             (PixelType)in_stack_fffffffffffff600,(int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff5f8 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  Classifier::~Classifier((Classifier *)0xa646b0);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  Classifier::Classifier
            (in_stack_fffffffffffff610,in_stack_fffffffffffff608,
             (CompressorScheme)((ulong)in_stack_fffffffffffff600 >> 0x20),
             (PixelType)in_stack_fffffffffffff600,(int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff5f8 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  Classifier::~Classifier((Classifier *)0xa6475f);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  Classifier::Classifier
            (in_stack_fffffffffffff610,in_stack_fffffffffffff608,
             (CompressorScheme)((ulong)in_stack_fffffffffffff600 >> 0x20),
             (PixelType)in_stack_fffffffffffff600,(int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff5f8 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  Classifier::~Classifier((Classifier *)0xa6480c);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  Classifier::Classifier
            (in_stack_fffffffffffff610,in_stack_fffffffffffff608,
             (CompressorScheme)((ulong)in_stack_fffffffffffff600 >> 0x20),
             (PixelType)in_stack_fffffffffffff600,(int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff5f8 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  Classifier::~Classifier((Classifier *)0xa648bb);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator(&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  Classifier::Classifier
            (in_stack_fffffffffffff610,in_stack_fffffffffffff608,
             (CompressorScheme)((ulong)in_stack_fffffffffffff600 >> 0x20),
             (PixelType)in_stack_fffffffffffff600,(int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff5f8 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  Classifier::~Classifier((Classifier *)0xa64968);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  Classifier::Classifier
            (in_stack_fffffffffffff610,in_stack_fffffffffffff608,
             (CompressorScheme)((ulong)in_stack_fffffffffffff600 >> 0x20),
             (PixelType)in_stack_fffffffffffff600,(int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff5f8 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  Classifier::~Classifier((Classifier *)0xa64a17);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator(&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  Classifier::Classifier
            (in_stack_fffffffffffff610,in_stack_fffffffffffff608,
             (CompressorScheme)((ulong)in_stack_fffffffffffff600 >> 0x20),
             (PixelType)in_stack_fffffffffffff600,(int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff5f8 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  Classifier::~Classifier((Classifier *)0xa64ac4);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator(&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  Classifier::Classifier
            (in_stack_fffffffffffff610,in_stack_fffffffffffff608,
             (CompressorScheme)((ulong)in_stack_fffffffffffff600 >> 0x20),
             (PixelType)in_stack_fffffffffffff600,(int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff5f8 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  Classifier::~Classifier((Classifier *)0xa64b73);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  Classifier::Classifier
            (in_stack_fffffffffffff610,in_stack_fffffffffffff608,
             (CompressorScheme)((ulong)in_stack_fffffffffffff600 >> 0x20),
             (PixelType)in_stack_fffffffffffff600,(int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff5f8 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  Classifier::~Classifier((Classifier *)0xa64c20);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator(&local_329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  Classifier::Classifier
            (in_stack_fffffffffffff610,in_stack_fffffffffffff608,
             (CompressorScheme)((ulong)in_stack_fffffffffffff600 >> 0x20),
             (PixelType)in_stack_fffffffffffff600,(int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff5f8 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  Classifier::~Classifier((Classifier *)0xa64ccf);
  std::__cxx11::string::~string(local_380);
  std::allocator<char>::~allocator(&local_381);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  Classifier::Classifier
            (in_stack_fffffffffffff610,in_stack_fffffffffffff608,
             (CompressorScheme)((ulong)in_stack_fffffffffffff600 >> 0x20),
             (PixelType)in_stack_fffffffffffff600,(int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff5f8 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  Classifier::~Classifier((Classifier *)0xa64d7f);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  Classifier::Classifier
            (in_stack_fffffffffffff610,in_stack_fffffffffffff608,
             (CompressorScheme)((ulong)in_stack_fffffffffffff600 >> 0x20),
             (PixelType)in_stack_fffffffffffff600,(int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff5f8 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  Classifier::~Classifier((Classifier *)0xa64e2f);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator(&local_431);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  Classifier::Classifier
            (in_stack_fffffffffffff610,in_stack_fffffffffffff608,
             (CompressorScheme)((ulong)in_stack_fffffffffffff600 >> 0x20),
             (PixelType)in_stack_fffffffffffff600,(int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff5f8 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  Classifier::~Classifier((Classifier *)0xa64edf);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator(&local_489);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  Classifier::Classifier
            (in_stack_fffffffffffff610,in_stack_fffffffffffff608,
             (CompressorScheme)((ulong)in_stack_fffffffffffff600 >> 0x20),
             (PixelType)in_stack_fffffffffffff600,(int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff5f8 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  Classifier::~Classifier((Classifier *)0xa64f8f);
  std::__cxx11::string::~string(local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  Classifier::Classifier
            (in_stack_fffffffffffff610,in_stack_fffffffffffff608,
             (CompressorScheme)((ulong)in_stack_fffffffffffff600 >> 0x20),
             (PixelType)in_stack_fffffffffffff600,(int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff5f8 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  Classifier::~Classifier((Classifier *)0xa6503f);
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator(&local_539);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  Classifier::Classifier
            (in_stack_fffffffffffff610,in_stack_fffffffffffff608,
             (CompressorScheme)((ulong)in_stack_fffffffffffff600 >> 0x20),
             (PixelType)in_stack_fffffffffffff600,(int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff5f8 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  Classifier::~Classifier((Classifier *)0xa650ef);
  std::__cxx11::string::~string(local_590);
  std::allocator<char>::~allocator(&local_591);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  Classifier::Classifier
            (in_stack_fffffffffffff610,in_stack_fffffffffffff608,
             (CompressorScheme)((ulong)in_stack_fffffffffffff600 >> 0x20),
             (PixelType)in_stack_fffffffffffff600,(int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff5f8 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  Classifier::~Classifier((Classifier *)0xa6519f);
  std::__cxx11::string::~string(local_5e8);
  std::allocator<char>::~allocator(&local_5e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  Classifier::Classifier
            (in_stack_fffffffffffff610,in_stack_fffffffffffff608,
             (CompressorScheme)((ulong)in_stack_fffffffffffff600 >> 0x20),
             (PixelType)in_stack_fffffffffffff600,(int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff5f8 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  Classifier::~Classifier((Classifier *)0xa65245);
  std::__cxx11::string::~string(local_640);
  std::allocator<char>::~allocator(&local_641);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  Classifier::Classifier
            (in_stack_fffffffffffff610,in_stack_fffffffffffff608,
             (CompressorScheme)((ulong)in_stack_fffffffffffff600 >> 0x20),
             (PixelType)in_stack_fffffffffffff600,(int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff5f8 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  Classifier::~Classifier((Classifier *)0xa652e9);
  std::__cxx11::string::~string(local_698);
  std::allocator<char>::~allocator(&local_699);
  suffix = (string *)(in_RDI + 0x90);
  this_02 = (Classifier *)local_6f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  Classifier::Classifier
            (this_02,suffix,(CompressorScheme)((ulong)in_stack_fffffffffffff600 >> 0x20),
             (PixelType)in_stack_fffffffffffff600,(int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff5f8 >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  Classifier::~Classifier((Classifier *)0xa6538f);
  std::__cxx11::string::~string((string *)(local_6f1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_6f1);
  __s = (char *)(in_RDI + 0x90);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_749;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,in_stack_fffffffffffff5f0);
  Classifier::Classifier
            (this_02,suffix,(CompressorScheme)((ulong)this_01 >> 0x20),(PixelType)this_01,
             (int)((ulong)__s >> 0x20),SUB81((ulong)__s >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  Classifier::~Classifier((Classifier *)0xa65433);
  std::__cxx11::string::~string((string *)(local_749 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_749);
  __a = &local_7a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
  Classifier::Classifier
            (this_02,suffix,(CompressorScheme)((ulong)this_01 >> 0x20),(PixelType)this_01,
             (int)((ulong)__s >> 0x20),SUB81((ulong)__s >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  Classifier::~Classifier((Classifier *)0xa654d9);
  std::__cxx11::string::~string(local_7a0);
  std::allocator<char>::~allocator(&local_7a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
  Classifier::Classifier
            (this_02,suffix,(CompressorScheme)((ulong)this_01 >> 0x20),(PixelType)this_01,
             (int)((ulong)__s >> 0x20),SUB81((ulong)__s >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  Classifier::~Classifier((Classifier *)0xa6557e);
  std::__cxx11::string::~string(local_7f8);
  std::allocator<char>::~allocator(&local_7f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
  Classifier::Classifier
            (this_02,suffix,(CompressorScheme)((ulong)this_01 >> 0x20),(PixelType)this_01,
             (int)((ulong)__s >> 0x20),SUB81((ulong)__s >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  Classifier::~Classifier((Classifier *)0xa65624);
  std::__cxx11::string::~string(local_850);
  std::allocator<char>::~allocator(&local_851);
  __x = (value_type *)(in_RDI + 0x90);
  this_00 = (vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
             *)local_8a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
  Classifier::Classifier
            (this_02,suffix,(CompressorScheme)((ulong)this_01 >> 0x20),(PixelType)this_01,
             (int)((ulong)__s >> 0x20),SUB81((ulong)__s >> 0x18,0));
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  push_back(this_00,__x);
  Classifier::~Classifier((Classifier *)0xa656c7);
  std::__cxx11::string::~string((string *)(local_8a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_8a9);
  return;
}

Assistant:

void
DwaCompressor::initializeLegacyChannelRules ()
{
    _channelRules.clear();

    _channelRules.push_back (Classifier ("r",     LOSSY_DCT, HALF,   0, true));
    _channelRules.push_back (Classifier ("r",     LOSSY_DCT, FLOAT,  0, true));
    _channelRules.push_back (Classifier ("red",   LOSSY_DCT, HALF,   0, true));
    _channelRules.push_back (Classifier ("red",   LOSSY_DCT, FLOAT,  0, true));
    _channelRules.push_back (Classifier ("g",     LOSSY_DCT, HALF,   1, true));
    _channelRules.push_back (Classifier ("g",     LOSSY_DCT, FLOAT,  1, true));
    _channelRules.push_back (Classifier ("grn",   LOSSY_DCT, HALF,   1, true));
    _channelRules.push_back (Classifier ("grn",   LOSSY_DCT, FLOAT,  1, true));
    _channelRules.push_back (Classifier ("green", LOSSY_DCT, HALF,   1, true));
    _channelRules.push_back (Classifier ("green", LOSSY_DCT, FLOAT,  1, true));
    _channelRules.push_back (Classifier ("b",     LOSSY_DCT, HALF,   2, true));
    _channelRules.push_back (Classifier ("b",     LOSSY_DCT, FLOAT,  2, true));
    _channelRules.push_back (Classifier ("blu",   LOSSY_DCT, HALF,   2, true));
    _channelRules.push_back (Classifier ("blu",   LOSSY_DCT, FLOAT,  2, true));
    _channelRules.push_back (Classifier ("blue",  LOSSY_DCT, HALF,   2, true));
    _channelRules.push_back (Classifier ("blue",  LOSSY_DCT, FLOAT,  2, true));

    _channelRules.push_back (Classifier ("y",     LOSSY_DCT, HALF,  -1, true));
    _channelRules.push_back (Classifier ("y",     LOSSY_DCT, FLOAT, -1, true));
    _channelRules.push_back (Classifier ("by",    LOSSY_DCT, HALF,  -1, true));
    _channelRules.push_back (Classifier ("by",    LOSSY_DCT, FLOAT, -1, true));
    _channelRules.push_back (Classifier ("ry",    LOSSY_DCT, HALF,  -1, true));
    _channelRules.push_back (Classifier ("ry",    LOSSY_DCT, FLOAT, -1, true));
    _channelRules.push_back (Classifier ("a",     RLE,       UINT,  -1, true));
    _channelRules.push_back (Classifier ("a",     RLE,       HALF,  -1, true));
    _channelRules.push_back (Classifier ("a",     RLE,       FLOAT, -1, true));
}